

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O3

void ansv<unsigned_long,2,1,0>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  unsigned_long *puVar5;
  comm *comm_00;
  _Elt_pointer ppVar6;
  _Elt_pointer ppVar7;
  comm *comm_01;
  unsigned_long uVar8;
  _Elt_pointer ppVar9;
  pair<unsigned_long,_unsigned_long> *ppVar10;
  pair<unsigned_long,_unsigned_long> *ppVar11;
  pair<unsigned_long,_unsigned_long> *ppVar12;
  long *plVar13;
  _Map_pointer pppVar14;
  pair<unsigned_long,_unsigned_long> *ppVar15;
  _Map_pointer pppVar16;
  _Map_pointer pppVar17;
  pair<unsigned_long,_unsigned_long> *ppVar18;
  pair<unsigned_long,_unsigned_long> *ppVar19;
  unsigned_long uVar20;
  _Map_pointer pppVar21;
  long lVar22;
  ulong uVar23;
  pair<unsigned_long,_unsigned_long> *ppVar24;
  long lVar25;
  _Elt_pointer ppVar26;
  ulong uVar27;
  unsigned_long uVar28;
  unsigned_long uVar29;
  ulong *puVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar36;
  pointer puVar37;
  ulong uVar38;
  bool bVar39;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_208;
  pair<unsigned_long,_unsigned_long> *local_1b0;
  comm *local_1a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1a0;
  pair<unsigned_long,_unsigned_long> *local_198;
  pair<unsigned_long,_unsigned_long> *ppStack_190;
  pair<unsigned_long,_unsigned_long> *local_188;
  pair<unsigned_long,_unsigned_long> *ppStack_180;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_178;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_170;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  _Map_pointer local_150;
  pair<unsigned_long,_unsigned_long> *local_148;
  pair<unsigned_long,_unsigned_long> local_140;
  size_t local_130;
  unsigned_long local_128;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_120;
  size_type local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  _Map_pointer local_a0;
  pair<unsigned_long,_unsigned_long> *local_98;
  pair<unsigned_long,_unsigned_long> *local_90;
  long local_88;
  long local_80;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_58;
  
  local_208._M_impl.super__Deque_impl_data._M_finish._M_last =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_first =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_208._M_impl.super__Deque_impl_data._M_start._M_last =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_208._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_208._M_impl.super__Deque_impl_data._M_start._M_cur =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_208._M_impl.super__Deque_impl_data._M_start._M_first =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_208._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_208._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1a0 = right_nsv;
  local_188 = (pair<unsigned_long,_unsigned_long> *)left_nsv;
  local_178 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_130 = nonsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_208,0);
  local_108 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_1a8 = comm;
  uVar8 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_108,comm);
  lVar32 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar32 != 0) {
    lVar32 = lVar32 >> 3;
    do {
      ppVar12 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar18 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_208._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          uVar33 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar32 + -1];
          if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar18) {
            if (local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first <= uVar33
               ) break;
            operator_delete(ppVar18);
            ppVar18 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar18 + 0x20;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar18 + 0x1f;
            ppVar12 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar18;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar33)
            break;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar12);
        ppVar18 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
        if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar12) {
          do {
            uVar28 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start[lVar32 + -1];
            if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar18) {
              if (uVar28 != local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].
                            first) break;
              operator_delete(ppVar18);
              ppVar18 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar18 + 0x20;
              local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar18 + 0x1f;
              ppVar12 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar18;
              local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              if (uVar28 != local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              break;
              local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
          } while (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar12);
        }
      }
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(lVar32 + (uVar8 - 1));
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar32 + -1];
      if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_208._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_208,(pair<unsigned_long,_unsigned_long> *)&local_168);
      }
      else {
        (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar32 = lVar32 + -1;
    } while (lVar32 != 0);
  }
  local_58.current._M_cur = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58.current._M_first = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58.current._M_last = local_208._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58.current._M_node = local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_78.current._M_cur = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_78.current._M_first = local_208._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78.current._M_last = local_208._M_impl.super__Deque_impl_data._M_start._M_last;
  local_78.current._M_node = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_168,&local_58,&local_78,(allocator_type *)&local_b8);
  pvVar3 = *(void **)local_178;
  *(pointer *)local_178 =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_178 + 8) =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_178 + 0x10) =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pvVar3 != (void *)0x0) &&
     (operator_delete(pvVar3),
     local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar17 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar16 = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar9 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_198 = local_208._M_impl.super__Deque_impl_data._M_start._M_last;
  local_1b0 = (pair<unsigned_long,_unsigned_long> *)
              (((long)local_208._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_208._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
              ((long)local_208._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)local_208._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
              ((((ulong)((long)local_208._M_impl.super__Deque_impl_data._M_finish._M_node -
                        (long)local_208._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
              + (ulong)(local_208._M_impl.super__Deque_impl_data._M_finish._M_node ==
                       (_Map_pointer)0x0)) * 0x20);
  local_148 = local_208._M_impl.super__Deque_impl_data._M_start._M_first;
  pppVar14 = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  if (local_1b0 == (pair<unsigned_long,_unsigned_long> *)0x0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 1, indexing_type = 0]"
                 );
  }
  for (; pppVar14 < pppVar17; pppVar14 = pppVar14 + 1) {
    operator_delete(pppVar14[1]);
  }
  local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar16;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_first = local_148;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_last = local_198;
  local_170 = in;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar33 = 0;
    ppVar12 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
    ppVar18 = local_148;
LAB_001335e5:
    do {
      pppVar14 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
      if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar12) {
        uVar27 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar33];
        ppVar9 = ppVar12;
        if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar18) {
          if (uVar27 < local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first) {
            operator_delete(ppVar18);
            ppVar18 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar18 + 0x20;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar18 + 0x1f;
            ppVar9 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
            ppVar12 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar18;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            goto LAB_001335e5;
          }
        }
        else if (uVar27 < local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          goto LAB_001335e5;
        }
      }
      while( true ) {
        uVar27 = (long)local_208._M_impl.super__Deque_impl_data._M_finish._M_cur - (long)ppVar18 >>
                 4;
        puVar37 = (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar33];
        if (((long)local_208._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar9 >> 4) +
            uVar27 + ((((ulong)((long)pppVar14 -
                               (long)local_208._M_impl.super__Deque_impl_data._M_start._M_node) >> 3
                       ) - 1) + (ulong)(pppVar14 == (_Map_pointer)0x0)) * 0x20 < 2) break;
        ppVar26 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar18) {
          ppVar26 = pppVar14[-1] + 0x20;
        }
        if (puVar37 != (pointer)ppVar26[-1].first) break;
        uVar38 = uVar27 - 1;
        if ((long)uVar27 < 1) {
          uVar27 = (long)uVar38 >> 5;
LAB_001336e5:
          pppVar16 = pppVar14 + uVar27;
          ppVar11 = *pppVar16;
          ppVar12 = ppVar11 + uVar38 + uVar27 * -0x20;
        }
        else {
          if (0x20 < uVar27) {
            uVar27 = uVar38 >> 5;
            goto LAB_001336e5;
          }
          ppVar12 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          pppVar16 = pppVar14;
          ppVar11 = ppVar18;
        }
        if (ppVar12 == ppVar11) {
          ppVar12 = pppVar16[-1] + 0x20;
        }
        if (puVar37 != (pointer)ppVar12[-1].first) break;
        if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar18) {
          operator_delete(ppVar18);
          pppVar14 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          ppVar18 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar18 + 0x20;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar18 + 0x1f;
          ppVar9 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar18;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar14;
        }
        else {
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar33 + uVar8);
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = puVar37;
      if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_208._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_208,(pair<unsigned_long,_unsigned_long> *)&local_168);
      }
      else {
        (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = (unsigned_long)puVar37;
        (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar33 = uVar33 + 1;
      ppVar9 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
      ppVar12 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar18 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
    } while (uVar33 < (ulong)((long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar7 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVar6 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar26 = local_208._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar33 = (long)local_208._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar39 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0;
  local_198 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_208._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_208._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_208._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_150 = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_208._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_208._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_a0 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_178,*(undefined8 *)(local_178 + 8));
  pppVar17 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar16 = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar9 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_128 = (local_208._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar32 = ((long)ppVar26 - (long)local_198 >> 4) + ((long)ppVar6 - (long)ppVar7 >> 4) +
           (((uVar33 >> 3) - 1) + (ulong)bVar39) * 0x20;
  ppVar18 = local_208._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_190 = local_208._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar14 = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  comm_00 = local_1a8;
  if (lVar32 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 1, indexing_type = 0]"
                 );
  }
  for (; local_198 = ppVar18, local_1a8 = comm_00, pppVar14 < pppVar17; pppVar14 = pppVar14 + 1) {
    operator_delete(pppVar14[1]);
    ppVar18 = local_198;
    comm_00 = local_1a8;
  }
  local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar16;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_first = local_198;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_190;
  if (lVar32 + (long)local_1b0 != *(long *)(local_178 + 8) - *(long *)local_178 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 1, indexing_type = 0]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_168,&local_128,1,comm_00);
  local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b8,(long)comm_00->m_size,(value_type_conflict *)&local_d0,
             (allocator_type *)&local_100);
  local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_d0,(long)comm_00->m_size,(value_type_conflict *)&local_100,
             (allocator_type *)&local_e8);
  comm_01 = local_1a8;
  uVar1 = comm_00->m_rank;
  lVar32 = (long)(int)uVar1;
  if (0 < lVar32) {
    uVar33 = *(ulong *)((long)local_168.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar32 * 8 + -8);
    lVar22 = lVar32;
    uVar28 = 0;
    do {
      lVar25 = lVar22 + -1;
      ppVar18 = (pair<unsigned_long,_unsigned_long> *)(uVar28 + 1);
      if (uVar28 + 1 < local_1b0) {
        ppVar18 = local_1b0;
      }
      uVar27 = *(ulong *)((long)local_168.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar22 * 8 + -8);
      puVar30 = (ulong *)(uVar28 * 0x10 + *(long *)local_178);
      uVar20 = uVar28 - 1;
      do {
        uVar29 = (long)ppVar18 - 1;
        if (uVar20 + (1 - (long)ppVar18) == -1) break;
        uVar29 = uVar20 + 1;
        uVar38 = *puVar30;
        puVar30 = puVar30 + 2;
        uVar20 = uVar29;
      } while (uVar27 <= uVar38);
      if (uVar27 <= uVar33) {
        *(unsigned_long *)
         ((long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar25 * 8) = (uVar29 - uVar28) + 1;
        local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar25] = uVar28;
        uVar33 = uVar27;
        if (*(ulong *)((long)local_168.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar25 * 8) < local_128)
        break;
      }
      bVar39 = 1 < lVar22;
      lVar22 = lVar25;
      uVar28 = uVar29;
    } while (bVar39);
  }
  iVar2 = local_1a8->m_size;
  if ((int)uVar1 < iVar2 + -1) {
    lVar22 = *(long *)local_178;
    uVar23 = *(long *)(local_178 + 8) - lVar22 >> 4;
    uVar27 = ((unsigned_long *)
             ((long)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))[lVar32];
    local_198 = (pair<unsigned_long,_unsigned_long> *)
                local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    uVar33 = lVar32 + 1;
    uVar31 = (ulong)uVar1;
    uVar38 = uVar23 - 1;
    do {
      uVar35 = uVar38;
      if ((int)uVar1 < (int)uVar31) {
        uVar31 = uVar38 + 1;
        if (uVar38 + 1 < uVar23) {
          uVar31 = uVar23;
        }
        puVar30 = (ulong *)(uVar38 * 0x10 + lVar22 + 0x10);
        uVar34 = uVar38 - 1;
        do {
          uVar35 = uVar31 - 1;
          if (uVar23 <= uVar34 + 2) break;
          uVar35 = uVar34 + 1;
          uVar4 = *puVar30;
          puVar30 = puVar30 + 2;
          uVar34 = uVar35;
        } while (uVar4 <= uVar27);
      }
      uVar31 = local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar33];
      ppVar18 = (pair<unsigned_long,_unsigned_long> *)uVar38;
      if (local_1b0 < uVar38) {
        puVar30 = (ulong *)(uVar38 * 0x10 + lVar22);
        do {
          ppVar18 = (pair<unsigned_long,_unsigned_long> *)uVar38;
          if (*puVar30 < uVar31) break;
          uVar38 = uVar38 - 1;
          puVar30 = puVar30 + -2;
          ppVar18 = local_1b0;
        } while (local_1b0 < uVar38);
      }
      if (uVar31 <= uVar27) {
        local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar33] = (uVar35 - (long)ppVar18) + 1;
        local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar33] = (unsigned_long)ppVar18;
        uVar27 = uVar31;
        if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar33] < local_128) break;
      }
      uVar31 = uVar33 & 0xffffffff;
      uVar33 = uVar33 + 1;
      uVar38 = (ulong)ppVar18;
    } while (iVar2 != (int)uVar33);
  }
  mxx::all2all<unsigned_long>(&local_100,&local_b8,local_1a8);
  mxx::impl::get_displacements<unsigned_long>(&local_e8,&local_100);
  uVar28 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  uVar20 = local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_120,(size_type)(uVar28 + uVar20),(allocator_type *)&local_140);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_178,&local_b8,&local_d0,
             local_120.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_100,&local_e8,comm_01);
  local_1b0 = (pair<unsigned_long,_unsigned_long> *)
              local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[comm_01->m_rank];
  local_90 = (pair<unsigned_long,_unsigned_long> *)(uVar28 + uVar20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188,local_108);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_1a0,local_108);
  pppVar17 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar16 = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar9 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_198 = local_208._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_190 = local_208._M_impl.super__Deque_impl_data._M_start._M_last;
  pvVar36 = local_170;
  for (pppVar14 = local_208._M_impl.super__Deque_impl_data._M_start._M_node; local_170 = pvVar36,
      pppVar14 < pppVar17; pppVar14 = pppVar14 + 1) {
    operator_delete(pppVar14[1]);
    pvVar36 = local_170;
  }
  local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar16;
  lVar32 = (long)(pvVar36->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar36->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_first = local_198;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_190;
  if (lVar32 != 0) {
    lVar32 = lVar32 >> 3;
    local_198 = (pair<unsigned_long,_unsigned_long> *)(uVar8 - 1);
    do {
      uVar28 = (long)&local_198->first + lVar32;
      lVar32 = lVar32 + -1;
      if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_208._M_impl.super__Deque_impl_data._M_start._M_cur) {
        puVar37 = (pvVar36->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        ppVar18 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
        do {
          uVar33 = puVar37[lVar32];
          if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar18) {
            ppVar12 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            if (ppVar12[0x1f].first <= uVar33) break;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
            _M_impl).super__Vector_impl_data._M_start[ppVar12[0x1f].second - uVar8] = uVar28;
            ppVar9 = ppVar12 + 0x20;
          }
          else {
            if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar33)
            break;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar8] = uVar28;
            ppVar9 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar20 = ppVar9[-1].first;
          uVar29 = ppVar9[-1].second;
          if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar18)
          goto LAB_00133d5c;
          while( true ) {
            operator_delete(ppVar18);
            ppVar18 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar18 + 0x20;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar18 + 0x1f;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar18;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            while( true ) {
              if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_208._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00133d9b;
              if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar18) break;
              if (uVar20 != local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              goto LAB_00133d92;
              (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
              _M_impl).super__Vector_impl_data._M_start
              [local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar8] =
                   uVar29;
LAB_00133d5c:
              local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (uVar20 != local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first
               ) break;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar8] =
                 uVar29;
          }
LAB_00133d92:
          if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_208._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        } while( true );
      }
LAB_00133d9b:
      pvVar36 = local_170;
      local_140.first =
           (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar32];
      local_140.second = uVar28;
      if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_208._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_208,&local_140);
      }
      else {
        (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_140.first;
        (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar28;
        local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (lVar32 != 0);
  }
  ppVar18 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar12 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (local_1b0 != (pair<unsigned_long,_unsigned_long> *)0x0) {
    local_98 = (pair<unsigned_long,_unsigned_long> *)((long)&local_1b0[-1].second + 7);
    local_88 = (long)local_1b0 * 0x10 + -0x10;
    ppVar19 = (pair<unsigned_long,_unsigned_long> *)0x0;
    ppVar11 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
LAB_00133e30:
    if (ppVar11 != ppVar12) {
      lVar32 = (long)&local_1b0->first + ~(ulong)ppVar19;
      local_80 = lVar32 * 0x10;
      local_1a8 = (comm *)local_120.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar32].second;
      local_198 = local_120.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar32;
      ppVar15 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
      local_148 = ppVar19;
LAB_00133e7d:
      if (ppVar11 == ppVar15) {
        ppVar19 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        if (ppVar19[0x1f].first <= local_198->first) goto LAB_00133ff4;
        (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->_M_impl
        ).super__Vector_impl_data._M_start[ppVar19[0x1f].second - uVar8] = (unsigned_long)local_1a8;
        uVar28 = ppVar19[0x1f].first;
        uVar20 = ppVar19[0x1f].second;
        operator_delete(ppVar15);
        ppVar15 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar15 + 0x20;
        ppVar11 = ppVar15 + 0x1f;
        ppVar12 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar15;
        local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        if (ppVar11[-1].first <= local_198->first) goto LAB_00133ff4;
        (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->_M_impl
        ).super__Vector_impl_data._M_start[ppVar11[-1].second - uVar8] = (unsigned_long)local_1a8;
        uVar28 = ppVar11[-1].first;
        uVar20 = ppVar11[-1].second;
        ppVar11 = ppVar11 + -1;
      }
      ppVar18 = ppVar11;
      local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar11;
      if (ppVar11 != ppVar12) {
        do {
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar11;
          if (ppVar11 == ppVar15) {
            if (uVar28 != local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first
               ) goto LAB_00133fe3;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar8] =
                 uVar20;
            operator_delete(ppVar15);
            ppVar15 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar15 + 0x20;
            ppVar11 = ppVar15 + 0x1f;
            ppVar12 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar15;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (uVar28 != ppVar11[-1].first) goto LAB_00133fe3;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
            _M_impl).super__Vector_impl_data._M_start[ppVar11[-1].second - uVar8] = uVar20;
            ppVar11 = ppVar11 + -1;
          }
          ppVar18 = ppVar11;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar11;
          if (ppVar11 == ppVar12) break;
        } while( true );
      }
      goto LAB_00133ff4;
    }
  }
LAB_00134176:
  pppVar14 = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  local_1a8 = (comm *)local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (ppVar18 != ppVar12) {
    local_198 = (pair<unsigned_long,_unsigned_long> *)
                (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)
                ->_M_impl).super__Vector_impl_data._M_start;
    pppVar16 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar9 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_001341b4:
    puVar37 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
              _M_impl).super__Vector_impl_data._M_start;
    pppVar17 = pppVar16;
    ppVar11 = ppVar18;
    ppVar19 = ppVar9;
    do {
      uVar38 = (long)ppVar11 - (long)ppVar19 >> 4;
      uVar33 = uVar38 - 1;
      uVar31 = (long)uVar33 >> 5;
      uVar27 = uVar31;
      if ((long)uVar38 < 1) {
LAB_001341ee:
        ppVar15 = pppVar17[uVar27] + uVar33 + uVar27 * -0x20;
      }
      else {
        if (0x20 < uVar38) {
          uVar27 = uVar33 >> 5;
          goto LAB_001341ee;
        }
        ppVar15 = ppVar11 + -1;
      }
      if (ppVar15 == ppVar12) goto LAB_001342b8;
      ppVar15 = ppVar18;
      if (ppVar18 == ppVar9) {
        ppVar15 = pppVar16[-1] + 0x20;
      }
      if ((long)uVar38 < 1) {
LAB_00134242:
        pppVar21 = pppVar17 + uVar31;
        ppVar24 = *pppVar21;
        ppVar10 = ppVar24 + uVar33 + uVar31 * -0x20;
      }
      else {
        if (0x20 < uVar38) {
          uVar31 = uVar33 >> 5;
          goto LAB_00134242;
        }
        ppVar10 = ppVar11 + -1;
        pppVar21 = pppVar17;
        ppVar24 = ppVar19;
      }
      if (ppVar10 == ppVar24) {
        ppVar10 = pppVar21[-1] + 0x20;
      }
      if (ppVar15[-1].first != ppVar10[-1].first) goto LAB_001342b8;
      if (ppVar11 == ppVar19) {
        ppVar19 = pppVar17[-1];
        pppVar17 = pppVar17 + -1;
        ppVar11 = ppVar19 + 0x20;
      }
      ppVar15 = ppVar18;
      if (ppVar18 == ppVar9) {
        ppVar15 = pppVar16[-1] + 0x20;
      }
      ppVar11 = ppVar11 + -1;
      ppVar10 = ppVar11;
      if (ppVar11 == ppVar19) {
        ppVar10 = pppVar17[-1] + 0x20;
      }
      puVar37[ppVar10[-1].second - uVar8] = ppVar15[-1].second;
    } while( true );
  }
LAB_00134311:
  local_188 = local_208._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_180 = local_208._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar16 = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  if (local_208._M_impl.super__Deque_impl_data._M_start._M_node <
      local_208._M_impl.super__Deque_impl_data._M_finish._M_node) {
    do {
      pppVar17 = pppVar16 + 1;
      operator_delete(pppVar16[1]);
      pppVar16 = pppVar17;
    } while (pppVar17 < local_1a8);
  }
  local_208._M_impl.super__Deque_impl_data._M_finish._M_first = local_188;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_180;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar14;
  puVar37 = (pvVar36->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
  if ((pvVar36->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar37) {
    uVar33 = 0;
    do {
      uVar28 = uVar33 + uVar8;
      ppVar9 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
      while (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar9) {
        uVar27 = puVar37[uVar33];
        if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_208._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar18 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          if (ppVar18[0x1f].first <= uVar27) {
            if (uVar27 == ppVar18[0x1f].first) {
              (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start[ppVar18[0x1f].second - uVar8] = uVar28;
              operator_delete(local_208._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_208._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_208._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_208._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_208._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            break;
          }
          (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar18[0x1f].second - uVar8] = uVar28;
          operator_delete(local_208._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_208._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_208._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          ppVar9 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar27) {
            if (uVar27 == local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
              (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start
              [local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar8] =
                   uVar28;
              local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            break;
          }
          (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start
          [local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar8] = uVar28;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      pvVar36 = local_170;
      local_140.first =
           (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar33];
      local_140.second = uVar28;
      if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_208._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_208,&local_140);
      }
      else {
        (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_140.first;
        (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar28;
        local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar33 = uVar33 + 1;
      puVar37 = (pvVar36->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
    } while (uVar33 < (ulong)((long)(pvVar36->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar37 >> 3
                             ));
  }
  ppVar18 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_90 != local_1b0) {
    lVar22 = (long)local_90 - (long)local_1b0;
    lVar32 = 0;
    local_1b0 = (pair<unsigned_long,_unsigned_long> *)((long)local_1b0 << 4);
    do {
      if (ppVar18 == local_208._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      puVar5 = &(local_120.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first;
      ppVar12 = local_1b0 + lVar32;
      uVar28 = *(unsigned_long *)((long)&local_1b0[lVar32].second + (long)puVar5);
      ppVar11 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
      do {
        uVar33 = *(ulong *)((long)&ppVar12->first + (long)puVar5);
        if (ppVar18 == local_208._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar11 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          if (ppVar11[0x1f].first <= uVar33) {
            if (uVar33 == ppVar11[0x1f].first) {
              (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start[ppVar11[0x1f].second - uVar8] = uVar28;
              operator_delete(local_208._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_208._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_208._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_208._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              ppVar18 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar18;
              local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            break;
          }
          (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar11[0x1f].second - uVar8] = uVar28;
          operator_delete(local_208._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_208._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_208._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          ppVar18 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          ppVar11 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          if (ppVar18[-1].first <= uVar33) {
            if (uVar33 == ppVar18[-1].first) {
              (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start[ppVar18[-1].second - uVar8] = uVar28;
              ppVar18 = ppVar18 + -1;
              local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar18;
            }
            break;
          }
          (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar18[-1].second - uVar8] = uVar28;
          ppVar18 = ppVar18 + -1;
        }
        local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar18;
      } while (ppVar18 != ppVar11);
      lVar32 = lVar32 + 1;
    } while (lVar32 != lVar22 + (ulong)(lVar22 == 0));
  }
  if (ppVar18 != local_208._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar37 = (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start;
    pppVar14 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar12 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      if (ppVar18 == ppVar12) {
        ppVar12 = pppVar14[-1];
        pppVar14 = pppVar14 + -1;
        puVar37[ppVar12[0x1f].second - uVar8] = local_130;
        ppVar18 = ppVar12 + 0x20;
      }
      else {
        puVar37[ppVar18[-1].second - uVar8] = local_130;
      }
      ppVar18 = ppVar18 + -1;
    } while (ppVar18 != local_208._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_178,&local_120);
  if (local_120.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_120.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pair<unsigned_long,_unsigned_long> *)
      local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pair<unsigned_long,_unsigned_long> *)
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Deque_base(&local_208);
  return;
LAB_00133fe3:
  ppVar18 = ppVar11;
  if (ppVar11 == ppVar12) goto LAB_00133ff4;
  goto LAB_00133e7d;
LAB_00133ff4:
  pvVar36 = local_170;
  ppVar19 = local_148;
  if (ppVar11 != ppVar12) {
    ppVar15 = ppVar11;
    if (ppVar11 == local_208._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar15 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    if (*(unsigned_long *)
         ((long)&(local_120.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first + local_80) == ppVar15[-1].first
       ) {
      ppVar11 = ppVar18;
      if (lVar32 != 0) {
        plVar13 = (long *)((long)&local_120.
                                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-(long)local_148].first
                          + local_88);
        ppVar18 = local_148;
        do {
          ppVar19 = ppVar18;
          if (*plVar13 != plVar13[-2]) goto LAB_0013407d;
          ppVar18 = (pair<unsigned_long,_unsigned_long> *)((long)&ppVar18->first + 1);
          plVar13 = plVar13 + -2;
          lVar32 = lVar32 + -1;
          ppVar19 = local_98;
        } while (lVar32 != 0);
      }
      lVar32 = 0;
LAB_0013407d:
      ppVar18 = ppVar11;
      if (ppVar11 != ppVar12) {
        if (ppVar11 == local_208._M_impl.super__Deque_impl_data._M_finish._M_first) {
          if (local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first !=
              local_120.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar32].first) goto LAB_00134168;
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
          _M_impl).super__Vector_impl_data._M_start
          [local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar8] =
               local_120.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar32].second;
          operator_delete(local_208._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_208._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_208._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          ppVar11 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          ppVar12 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar11;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          if (ppVar11[-1].first !=
              local_120.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar32].first) goto LAB_00134168;
          ppVar18 = ppVar11 + -1;
          ppVar11 = ppVar11 + -1;
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
          _M_impl).super__Vector_impl_data._M_start[ppVar18->second - uVar8] =
               local_120.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar32].second;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar11;
        }
        goto LAB_0013407d;
      }
    }
  }
LAB_00134168:
  ppVar19 = (pair<unsigned_long,_unsigned_long> *)((long)&ppVar19->first + 1);
  if (local_1b0 <= ppVar19) goto LAB_00134176;
  goto LAB_00133e30;
LAB_001342b8:
  if (ppVar18 == ppVar9) {
    ppVar18 = pppVar16[-1] + 0x20;
  }
  *(size_t *)((long)local_198 + (ppVar18[-1].second - uVar8) * 8) = local_130;
  if (ppVar11 == ppVar19) {
    ppVar19 = pppVar17[-1];
    pppVar17 = pppVar17 + -1;
    ppVar11 = ppVar19 + 0x20;
  }
  ppVar18 = ppVar11 + -1;
  pppVar16 = pppVar17;
  ppVar9 = ppVar19;
  pvVar36 = local_170;
  if (ppVar18 == ppVar12) goto LAB_00134311;
  goto LAB_001341b4;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}